

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator*(unsigned_long lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar5;
  ulong uVar6;
  uint64_t u1;
  
  if (rhs.m_int < 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = -rhs.m_int;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = lhs;
    uVar6 = SUB168(auVar2 * auVar4,0);
    if ((SUB168(auVar2 * auVar4,8) == 0) && (uVar6 < 0x8000000000000001)) {
      return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)-uVar6;
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rhs.m_int;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lhs;
    SVar5.m_int = SUB168(auVar1 * auVar3,0);
    if ((SUB168(auVar1 * auVar3,8) == 0) && (-1 < SVar5.m_int)) {
      return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)SVar5.m_int;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY SafeInt< T, E > operator *( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    T ret( 0 );
    MultiplicationHelper< T, U, MultiplicationMethod< T, U >::method >::template MultiplyThrow< E >( (T)rhs, lhs, ret );
    return SafeInt< T, E >(ret);
}